

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Float32_To_Int24_Clip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float fVar1;
  float *src;
  int iVar2;
  uchar *dest;
  undefined1 *puVar3;
  float fVar4;
  
  if (count != 0) {
    puVar3 = (undefined1 *)((long)destinationBuffer + 2);
    do {
      fVar4 = *sourceBuffer * 2.1474836e+09;
      iVar2 = -0x80000000;
      if (-2.1474836e+09 <= fVar4) {
        fVar1 = 2.1474836e+09;
        if (fVar4 <= 2.1474836e+09) {
          fVar1 = fVar4;
        }
        iVar2 = (int)fVar1;
      }
      count = count - 1;
      puVar3[-2] = (char)((uint)iVar2 >> 8);
      puVar3[-1] = (char)((uint)iVar2 >> 0x10);
      *puVar3 = (char)((uint)iVar2 >> 0x18);
      puVar3 = puVar3 + destinationStride * 3;
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
    } while (count != 0);
  }
  return;
}

Assistant:

static void Float32_To_Int24_Clip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    PaInt32 temp;

    (void) ditherGenerator; /* unused parameter */
    
    while( count-- )
    {
        /* convert to 32 bit and drop the low 8 bits */
        double scaled = *src * 0x7FFFFFFF;
        PA_CLIP_( scaled, -2147483648., 2147483647.  );
        temp = (PaInt32) scaled;

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = (unsigned char)(temp >> 8);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 24);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(temp >> 24);
        dest[1] = (unsigned char)(temp >> 16);
        dest[2] = (unsigned char)(temp >> 8);
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}